

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRBlock * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::allocate<>
          (ObjectPool<spirv_cross::SPIRBlock> *this)

{
  Vector<spirv_cross::SPIRBlock_*> *this_00;
  _Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
  _Var1;
  ulong uVar2;
  size_t sVar3;
  _Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> _Var4;
  SPIRBlock *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
  if (sVar3 == 0) {
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
            .buffer_size;
    uVar2 = (ulong)(this->start_object_count << ((byte)sVar3 & 0x1f));
    _Var1.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>)malloc(uVar2 * 0x3d0);
    if (_Var1.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl ==
        (SPIRBlock *)0x0) {
      return (SPIRBlock *)0x0;
    }
    if (uVar2 != 0) {
      sVar3 = 0;
      _Var4._M_head_impl =
           (SPIRBlock *)_Var1.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRBlock_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar3] = _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar3 + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRBlock_*,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false> =
         _Var1.super__Head_base<0UL,_spirv_cross::SPIRBlock_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_003483af;
  }
  else {
    pSVar5 = (this_00->super_VectorView<spirv_cross::SPIRBlock_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRBlock_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_003483af:
  memset(&(pSVar5->super_IVariant).self,0,0x3c8);
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRBlock_003fa9c8;
  *(undefined8 *)&(pSVar5->super_IVariant).field_0xc = 0;
  pSVar5->hint = HintNone;
  pSVar5->next_block = 0;
  pSVar5->merge_block = 0;
  pSVar5->continue_block = 0;
  pSVar5->return_value = 0;
  pSVar5->condition = 0;
  pSVar5->true_block = 0;
  pSVar5->false_block = 0;
  pSVar5->default_block = 0;
  (pSVar5->mesh).groups[0] = 0;
  (pSVar5->mesh).groups[0] = 0;
  (pSVar5->mesh).groups[1] = 0;
  *(undefined8 *)((pSVar5->mesh).groups + 2) = 0;
  (pSVar5->ops).super_VectorView<spirv_cross::Instruction>.ptr =
       (Instruction *)&(pSVar5->ops).stack_storage;
  (pSVar5->ops).buffer_capacity = 8;
  (pSVar5->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr =
       (Phi *)&(pSVar5->phi_variables).stack_storage;
  (pSVar5->phi_variables).buffer_capacity = 8;
  (pSVar5->declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
          *)&(pSVar5->declare_temporary).stack_storage;
  (pSVar5->declare_temporary).buffer_capacity = 8;
  (pSVar5->potential_declare_temporary).
  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
  .ptr = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
          *)&(pSVar5->potential_declare_temporary).stack_storage;
  (pSVar5->potential_declare_temporary).buffer_capacity = 8;
  (pSVar5->cases_32bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
       (Case *)&(pSVar5->cases_32bit).stack_storage;
  (pSVar5->cases_32bit).buffer_capacity = 8;
  (pSVar5->cases_64bit).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr =
       (Case *)&(pSVar5->cases_64bit).stack_storage;
  (pSVar5->cases_64bit).buffer_capacity = 8;
  pSVar5->complex_continue = false;
  (pSVar5->ignore_phi_from_block).id = 0;
  (pSVar5->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = 0;
  (pSVar5->dominated_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(pSVar5->dominated_variables).stack_storage;
  (pSVar5->dominated_variables).buffer_capacity = 8;
  (pSVar5->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(pSVar5->loop_variables).stack_storage;
  (pSVar5->loop_variables).buffer_capacity = 8;
  (pSVar5->invalidate_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar5->invalidate_expressions).stack_storage;
  (pSVar5->invalidate_expressions).buffer_capacity = 8;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}